

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_function.hpp
# Opt level: O3

void duckdb::MultiFileFunction<duckdb::ParquetMultiFileInfo>::MultiFileScan
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  DataChunk *this;
  MultiFileLocalState *scan_data;
  MultiFileGlobalState *gstate;
  MultiFileBindData *bind_data;
  idx_t iVar1;
  bool bVar2;
  ParquetReadLocalState *local_state;
  ParquetReader *this_00;
  type pLVar3;
  pointer pMVar4;
  type pBVar5;
  ParquetReader *reader;
  
  if ((data_p->local_state).ptr != (LocalTableFunctionState *)0x0) {
    optional_ptr<duckdb::LocalTableFunctionState,_true>::CheckValid(&data_p->local_state);
    scan_data = (MultiFileLocalState *)(data_p->local_state).ptr;
    optional_ptr<duckdb::GlobalTableFunctionState,_true>::CheckValid(&data_p->global_state);
    gstate = (MultiFileGlobalState *)(data_p->global_state).ptr;
    optional_ptr<const_duckdb::FunctionData,_true>::CheckValid(&data_p->bind_data);
    bind_data = (MultiFileBindData *)(data_p->bind_data).ptr;
    this = &scan_data->scan_chunk;
    do {
      DataChunk::Reset(this);
      this_00 = (ParquetReader *)
                shared_ptr<duckdb::BaseFileReader,_true>::operator*(&scan_data->reader);
      unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
      ::operator*(&gstate->global_state);
      pLVar3 = unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>,_true>
               ::operator*(&scan_data->local_state);
      ParquetReader::Scan(this_00,context,(ParquetReaderScanState *)(pLVar3 + 1),this);
      iVar1 = (scan_data->scan_chunk).count;
      output->count = iVar1;
      if (iVar1 != 0) {
        pMVar4 = unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
                 ::operator->(&bind_data->multi_file_reader);
        pBVar5 = shared_ptr<duckdb::BaseFileReader,_true>::operator*(&scan_data->reader);
        optional_ptr<duckdb::MultiFileReaderData,_true>::CheckValid(&scan_data->reader_data);
        (*pMVar4->_vptr_MultiFileReader[0xc])
                  (pMVar4,context,bind_data,pBVar5,(scan_data->reader_data).ptr,this,output,
                   &scan_data->executor,
                   (gstate->multi_file_reader_state).
                   super_unique_ptr<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
                   ._M_t.
                   super___uniq_ptr_impl<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::MultiFileReaderGlobalState_*,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
                   .super__Head_base<0UL,_duckdb::MultiFileReaderGlobalState_*,_false>._M_head_impl)
        ;
        return;
      }
      DataChunk::Reset(this);
      bVar2 = TryInitializeNextBatch(context,bind_data,scan_data,gstate);
    } while (bVar2);
  }
  return;
}

Assistant:

static void MultiFileScan(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
		if (!data_p.local_state) {
			return;
		}
		auto &data = data_p.local_state->Cast<MultiFileLocalState>();
		auto &gstate = data_p.global_state->Cast<MultiFileGlobalState>();
		auto &bind_data = data_p.bind_data->CastNoConst<MultiFileBindData>();

		do {
			auto &scan_chunk = data.scan_chunk;
			scan_chunk.Reset();

			OP::Scan(context, *data.reader, *gstate.global_state, *data.local_state, scan_chunk);
			output.SetCardinality(scan_chunk.size());
			if (scan_chunk.size() > 0) {
				bind_data.multi_file_reader->FinalizeChunk(context, bind_data, *data.reader, *data.reader_data,
				                                           scan_chunk, output, data.executor,
				                                           gstate.multi_file_reader_state);
				return;
			}
			scan_chunk.Reset();
			if (!TryInitializeNextBatch(context, bind_data, data, gstate)) {
				return;
			}
		} while (true);
	}